

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseProblem.h
# Opt level: O0

void covenant::parse_problem<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
               (CFGProblem *p,StrParse *input,shared_ptr<covenant::TerminalFactory> *tfac)

{
  bool bVar1;
  char cVar2;
  undefined8 uVar3;
  StrParse *in_RSI;
  shared_ptr<covenant::TerminalFactory> *in_RDI;
  char c;
  shared_ptr<covenant::TerminalFactory> *in_stack_000000a0;
  StrParse *in_stack_000000a8;
  CFGProblem *in_stack_000000b0;
  shared_ptr<covenant::TerminalFactory> *in_stack_ffffffffffffff68;
  StrParse *in_stack_ffffffffffffff70;
  allocator local_41;
  string local_40 [39];
  char local_19;
  StrParse *local_10;
  shared_ptr<covenant::TerminalFactory> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  consume_blanks<covenant::StrParse>(in_stack_ffffffffffffff70);
  while( true ) {
    bVar1 = StrParse::empty(in_stack_ffffffffffffff70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      return;
    }
    local_19 = StrParse::peek(in_stack_ffffffffffffff70);
    cVar2 = StrParse::peek(in_stack_ffffffffffffff70);
    if (cVar2 == ')') break;
    if (local_19 == ';') {
      consume_comment<covenant::StrParse>(in_stack_ffffffffffffff70);
    }
    else {
      cVar2 = StrParse::peek(in_stack_ffffffffffffff70);
      if (cVar2 != '(') {
        uVar3 = __cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_40,"make sure CFG is enclosed between parenthesis",&local_41);
        error::error((error *)in_stack_ffffffffffffff70,(string *)in_stack_ffffffffffffff68);
        __cxa_throw(uVar3,&error::typeinfo,error::~error);
      }
      consume_blanks<covenant::StrParse>(in_stack_ffffffffffffff70);
      in_stack_ffffffffffffff68 = local_8;
      in_stack_ffffffffffffff70 = local_10;
      boost::shared_ptr<covenant::TerminalFactory>::shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)local_10,local_8);
      parse_constraint<covenant::StrParse,boost::shared_ptr<covenant::TerminalFactory>>
                (in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
      boost::shared_ptr<covenant::TerminalFactory>::~shared_ptr
                ((shared_ptr<covenant::TerminalFactory> *)0x1c9d2a);
      consume_blanks<covenant::StrParse>(in_stack_ffffffffffffff70);
    }
  }
  return;
}

Assistant:

void parse_problem(CFGProblem& p, In& input, TerminalFactory tfac)
{

  consume_blanks(input);
  while(!input.empty())
  {
    char c = input.peek();
    // gross fix if the last constraint does not finish with some blank
    if (input.peek() == ')') break;

    if(c == ';')
    {
      // Comment line.
      consume_comment(input);
    } 
    else 
    {
      if (input.peek() != '(')
        throw error("make sure CFG is enclosed between parenthesis");

      consume_blanks(input);
      parse_constraint(p, input, tfac);
      consume_blanks(input);
    }
  }
}